

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O1

value hello_world_object_impl_interface_get(object obj,object_impl impl,accessor_type *accessor)

{
  int iVar1;
  char *__s1;
  value pvVar2;
  
  __s1 = (char *)attribute_name((accessor->data).key);
  iVar1 = strcmp(__s1,"d");
  if (iVar1 == 0) {
    pvVar2 = (value)value_create_char((int)*impl);
    return pvVar2;
  }
  iVar1 = strcmp(__s1,"e");
  if (iVar1 != 0) {
    return (value)0x0;
  }
  pvVar2 = (value)value_create_long(*(undefined8 *)((long)impl + 8));
  return pvVar2;
}

Assistant:

value hello_world_object_impl_interface_get(object obj, object_impl impl, struct accessor_type *accessor)
{
	hello_world_object hello_world = (hello_world_object)impl;
	attribute attr = accessor->data.attr;
	const char *key = attribute_name(attr);

	(void)obj;

	// Horrible but it is just a ilustrative example
	if (strcmp(key, "d") == 0)
	{
		return value_create_char(hello_world->d);
	}
	else if (strcmp(key, "e") == 0)
	{
		return value_create_long(hello_world->e);
	}

	return NULL;
}